

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baillie_test.hpp
# Opt level: O2

int D_chooser(int candidate)

{
  bool bVar1;
  int iVar2;
  int n;
  
  n = 5;
  while( true ) {
    iVar2 = jacobiSymbol(n,candidate);
    if (iVar2 == -1) break;
    bVar1 = n < 1;
    n = -2 - n;
    if (bVar1) {
      n = 2;
    }
  }
  return n;
}

Assistant:

int D_chooser(int candidate) {
    int D = 5;
    while ( jacobiSymbol(D, candidate) != -1 ){
        if (D > 0 ) {
            D +=2;
        }else {
            D = -2;
        }
        D *= -1;
    }
    return D;
}